

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

Expression * readE(TokenScanner *scanner,int prec)

{
  int prec_00;
  CompoundExp *lhs;
  Expression *rhs;
  CompoundExp *this;
  string token;
  ErrorException err;
  undefined1 *local_d8;
  long local_d0;
  undefined1 local_c8;
  undefined7 uStack_c7;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  
  lhs = (CompoundExp *)readT(scanner);
  local_d8 = &local_c8;
  local_d0 = 0;
  local_c8 = 0;
  do {
    TokenScanner::nextToken_abi_cxx11_(&local_58,scanner);
    std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_78,local_d8,local_d8 + local_d0);
    prec_00 = precedence(&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if (prec < prec_00) {
      rhs = readE(scanner,prec_00);
      this = (CompoundExp *)operator_new(0x38);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_d8,local_d8 + local_d0);
      CompoundExp::CompoundExp(this,&local_b8,&lhs->super_Expression,rhs);
      lhs = this;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
    }
  } while (prec < prec_00);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_d8,local_d8 + local_d0);
  TokenScanner::saveToken(scanner,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
  }
  return &lhs->super_Expression;
}

Assistant:

Expression *readE(TokenScanner & scanner, int prec) {
   Expression *exp = nullptr;
   Expression *rhs = nullptr;
   exp = readT(scanner);
   string token;
   try {
       while (true) {
           token = scanner.nextToken();
           int newPrec = precedence(token);
           if (newPrec <= prec) break;
           rhs = readE(scanner, newPrec);
           exp = new CompoundExp(token, exp, rhs);
       }
   } catch (ErrorException err) {
       if (exp != nullptr) delete exp;
       if (rhs != nullptr) delete rhs;
   }
   scanner.saveToken(token);
   return exp;
}